

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCastToTimestampMS::Operation<duckdb::date_t,_duckdb::timestamp_t>
               (date_t input,timestamp_t *result,bool strict)

{
  bool bVar1;
  timestamp_t in_RSI;
  bool unaff_retaddr;
  timestamp_t *in_stack_00000008;
  date_t in_stack_00000010;
  undefined1 local_1;
  
  bVar1 = TryCast::Operation<duckdb::date_t,_duckdb::timestamp_t>
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (bVar1) {
    bVar1 = Timestamp::IsFinite(in_RSI);
    if (bVar1) {
      *(long *)in_RSI.value = *(long *)in_RSI.value / 1000;
      local_1 = true;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TryCastToTimestampMS::Operation(date_t input, timestamp_t &result, bool strict) {
	if (!TryCast::Operation<date_t, timestamp_t>(input, result, strict)) {
		return false;
	}
	if (!Timestamp::IsFinite(result)) {
		return true;
	}
	result.value /= Interval::MICROS_PER_MSEC;
	return true;
}